

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
gch::detail::small_vector_base<std::allocator<int>,6u>::
small_vector_base<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (small_vector_base<std::allocator<int>,6u> *this,int *first,int *last)

{
  int *piVar1;
  small_vector_base<std::allocator<int>,6u> *psVar2;
  ulong __n;
  
  __n = (long)last - (long)first >> 2;
  if (__n < 7) {
    psVar2 = this + 0x18;
    *(undefined8 *)(this + 8) = 6;
    *(small_vector_base<std::allocator<int>,6u> **)this = psVar2;
    for (; first != last; first = first + 1) {
      *(int *)psVar2 = *first;
      psVar2 = psVar2 + 4;
    }
  }
  else {
    piVar1 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)this,__n,(void *)0x0);
    *(int **)this = piVar1;
    *(ulong *)(this + 8) = __n;
    for (; first != last; first = first + 1) {
      *piVar1 = *first;
      piVar1 = piVar1 + 1;
    }
  }
  *(ulong *)(this + 0x10) = __n;
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (ForwardIt first, ForwardIt last, std::forward_iterator_tag,
                         const alloc_ty& alloc)
        : alloc_interface (alloc)
      {
        size_ty count = external_range_length (first, last);
        if (InlineCapacity < count)
        {
          set_data_ptr (unchecked_allocate (count));
          set_capacity (count);
          GCH_TRY
          {
            uninitialized_copy (first, last, begin_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }